

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters_sse42_intr.c
# Opt level: O0

void ihevc_intra_pred_chroma_dc_sse42
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char cVar3;
  undefined8 *puVar4;
  int in_ECX;
  undefined8 *in_RDX;
  long in_RDI;
  int in_R8D;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  __m128i src_temp7;
  __m128i m_mask;
  __m128i src_temp6;
  __m128i src_temp5;
  __m128i src_temp4;
  __m128i src_temp3;
  __m128i src_temp1;
  WORD32 log2nt;
  WORD32 row;
  WORD32 dc_val_v;
  WORD32 dc_val_u;
  WORD32 acc_dc_v;
  WORD32 acc_dc_u;
  undefined1 local_998 [16];
  undefined1 local_988 [16];
  undefined1 local_948 [16];
  undefined1 local_938 [16];
  int local_908;
  ushort local_900;
  int local_8fc;
  int local_8f8;
  undefined8 *local_8e8;
  short local_838;
  short sStack_836;
  short sStack_834;
  short sStack_832;
  short sStack_830;
  short sStack_82e;
  short sStack_82c;
  short sStack_82a;
  short local_828;
  short sStack_826;
  short sStack_824;
  short sStack_822;
  short sStack_820;
  short sStack_81e;
  short sStack_81c;
  short sStack_81a;
  short local_7f8;
  short sStack_7f6;
  short sStack_7f4;
  short sStack_7f2;
  short sStack_7f0;
  short sStack_7ee;
  short sStack_7ec;
  short sStack_7ea;
  short local_7e8;
  short sStack_7e6;
  short sStack_7e4;
  short sStack_7e2;
  short sStack_7e0;
  short sStack_7de;
  short sStack_7dc;
  short sStack_7da;
  short local_7d8;
  short sStack_7d6;
  short sStack_7d4;
  short sStack_7d2;
  short sStack_7d0;
  short sStack_7ce;
  short sStack_7cc;
  short sStack_7ca;
  short local_7c8;
  short sStack_7c6;
  short sStack_7c4;
  short sStack_7c2;
  short sStack_7c0;
  short sStack_7be;
  short sStack_7bc;
  short sStack_7ba;
  short local_758;
  short sStack_756;
  short sStack_754;
  short sStack_752;
  short sStack_750;
  short sStack_74e;
  short sStack_74c;
  short sStack_74a;
  short local_748;
  short sStack_746;
  short sStack_744;
  short sStack_742;
  short sStack_740;
  short sStack_73e;
  short sStack_73c;
  short sStack_73a;
  short local_738;
  short sStack_736;
  short sStack_734;
  short sStack_732;
  short sStack_730;
  short sStack_72e;
  short sStack_72c;
  short sStack_72a;
  short local_728;
  short sStack_726;
  short sStack_724;
  short sStack_722;
  short sStack_720;
  short sStack_71e;
  short sStack_71c;
  short sStack_71a;
  short local_718;
  short sStack_716;
  short sStack_714;
  short sStack_712;
  short sStack_710;
  short sStack_70e;
  short sStack_70c;
  short sStack_70a;
  short local_708;
  short sStack_706;
  short sStack_704;
  short sStack_702;
  short sStack_700;
  short sStack_6fe;
  short sStack_6fc;
  short sStack_6fa;
  short local_6f8;
  short sStack_6f6;
  short sStack_6f4;
  short sStack_6f2;
  short sStack_6f0;
  short sStack_6ee;
  short sStack_6ec;
  short sStack_6ea;
  short local_6e8;
  short sStack_6e6;
  short sStack_6e4;
  short sStack_6e2;
  short sStack_6e0;
  short sStack_6de;
  short sStack_6dc;
  short sStack_6da;
  undefined8 local_418;
  undefined8 local_408;
  undefined8 local_3f8;
  int local_3e8;
  int local_3c8;
  int local_3a8;
  int local_388;
  int local_368;
  int local_348;
  __m128i temp_sad_2;
  __m128i temp_sad_1;
  __m128i temp_sad;
  __m128i m_zero;
  __m128i src_temp10;
  __m128i src_temp9;
  __m128i src_temp8;
  
  cVar3 = '\x05';
  switch(in_R8D) {
  case 4:
    cVar3 = '\x02';
    break;
  default:
    break;
  case 8:
    cVar3 = '\x03';
    break;
  case 0x10:
    cVar3 = '\x04';
    break;
  case 0x20:
    cVar3 = '\x05';
  }
  local_8f8 = 0;
  local_8fc = 0;
  if (in_R8D == 0x10) {
    auVar5 = pmovzxbw(*(undefined1 (*) [16])(in_RDI + 0x20),
                      *(undefined8 *)*(undefined1 (*) [16])(in_RDI + 0x20));
    auVar6 = pmovzxbw(*(undefined1 (*) [16])(in_RDI + 0x30),
                      *(undefined8 *)*(undefined1 (*) [16])(in_RDI + 0x30));
    auVar7 = pmovzxbw(*(undefined1 (*) [16])(in_RDI + 0x40),
                      *(undefined8 *)*(undefined1 (*) [16])(in_RDI + 0x40));
    auVar8 = pmovzxbw(*(undefined1 (*) [16])(in_RDI + 0x50),
                      *(undefined8 *)*(undefined1 (*) [16])(in_RDI + 0x50));
    local_938._8_8_ = 0;
    local_938._0_8_ = *(ulong *)(in_RDI + 0x28);
    local_948._8_8_ = 0;
    local_948._0_8_ = *(ulong *)(in_RDI + 0x38);
    local_988._8_8_ = 0;
    local_988._0_8_ = *(ulong *)(in_RDI + 0x48);
    local_998._8_8_ = 0;
    local_998._0_8_ = *(ulong *)(in_RDI + 0x58);
    auVar9 = pmovzxbw(local_938,*(ulong *)(in_RDI + 0x28));
    auVar10 = pmovzxbw(local_948,*(ulong *)(in_RDI + 0x38));
    auVar11 = pmovzxbw(local_988,*(ulong *)(in_RDI + 0x48));
    auVar12 = pmovzxbw(local_998,*(ulong *)(in_RDI + 0x58));
    local_6e8 = auVar10._0_2_;
    sStack_6e6 = auVar10._2_2_;
    sStack_6e4 = auVar10._4_2_;
    sStack_6e2 = auVar10._6_2_;
    sStack_6e0 = auVar10._8_2_;
    sStack_6de = auVar10._10_2_;
    sStack_6dc = auVar10._12_2_;
    sStack_6da = auVar10._14_2_;
    local_6f8 = auVar6._0_2_;
    sStack_6f6 = auVar6._2_2_;
    sStack_6f4 = auVar6._4_2_;
    sStack_6f2 = auVar6._6_2_;
    sStack_6f0 = auVar6._8_2_;
    sStack_6ee = auVar6._10_2_;
    sStack_6ec = auVar6._12_2_;
    sStack_6ea = auVar6._14_2_;
    local_708 = auVar9._0_2_;
    sStack_706 = auVar9._2_2_;
    sStack_704 = auVar9._4_2_;
    sStack_702 = auVar9._6_2_;
    sStack_700 = auVar9._8_2_;
    sStack_6fe = auVar9._10_2_;
    sStack_6fc = auVar9._12_2_;
    sStack_6fa = auVar9._14_2_;
    local_718 = auVar5._0_2_;
    sStack_716 = auVar5._2_2_;
    sStack_714 = auVar5._4_2_;
    sStack_712 = auVar5._6_2_;
    sStack_710 = auVar5._8_2_;
    sStack_70e = auVar5._10_2_;
    sStack_70c = auVar5._12_2_;
    sStack_70a = auVar5._14_2_;
    local_728 = auVar11._0_2_;
    sStack_726 = auVar11._2_2_;
    sStack_724 = auVar11._4_2_;
    sStack_722 = auVar11._6_2_;
    sStack_720 = auVar11._8_2_;
    sStack_71e = auVar11._10_2_;
    sStack_71c = auVar11._12_2_;
    sStack_71a = auVar11._14_2_;
    local_738 = auVar12._0_2_;
    sStack_736 = auVar12._2_2_;
    sStack_734 = auVar12._4_2_;
    sStack_732 = auVar12._6_2_;
    sStack_730 = auVar12._8_2_;
    sStack_72e = auVar12._10_2_;
    sStack_72c = auVar12._12_2_;
    sStack_72a = auVar12._14_2_;
    local_748 = auVar7._0_2_;
    sStack_746 = auVar7._2_2_;
    sStack_744 = auVar7._4_2_;
    sStack_742 = auVar7._6_2_;
    sStack_740 = auVar7._8_2_;
    sStack_73e = auVar7._10_2_;
    sStack_73c = auVar7._12_2_;
    sStack_73a = auVar7._14_2_;
    local_758 = auVar8._0_2_;
    sStack_756 = auVar8._2_2_;
    sStack_754 = auVar8._4_2_;
    sStack_752 = auVar8._6_2_;
    sStack_750 = auVar8._8_2_;
    sStack_74e = auVar8._10_2_;
    sStack_74c = auVar8._12_2_;
    sStack_74a = auVar8._14_2_;
    local_948._2_2_ =
         sStack_6e6 + sStack_6f6 + sStack_706 + sStack_716 +
         sStack_726 + sStack_736 + sStack_746 + sStack_756;
    local_948._0_2_ =
         local_6e8 + local_6f8 + local_708 + local_718 +
         local_728 + local_738 + local_748 + local_758;
    local_948._4_2_ =
         sStack_6e4 + sStack_6f4 + sStack_704 + sStack_714 +
         sStack_724 + sStack_734 + sStack_744 + sStack_754;
    local_948._6_2_ =
         sStack_6e2 + sStack_6f2 + sStack_702 + sStack_712 +
         sStack_722 + sStack_732 + sStack_742 + sStack_752;
    local_948._8_2_ =
         sStack_6e0 + sStack_6f0 + sStack_700 + sStack_710 +
         sStack_720 + sStack_730 + sStack_740 + sStack_750;
    local_948._10_2_ =
         sStack_6de + sStack_6ee + sStack_6fe + sStack_70e +
         sStack_71e + sStack_72e + sStack_73e + sStack_74e;
    local_948._12_2_ =
         sStack_6dc + sStack_6ec + sStack_6fc + sStack_70c +
         sStack_71c + sStack_72c + sStack_73c + sStack_74c;
    local_948._14_2_ =
         sStack_6da + sStack_6ea + sStack_6fa + sStack_70a +
         sStack_71a + sStack_72a + sStack_73a + sStack_74a;
    auVar10._8_8_ = local_948._8_8_;
    auVar10._0_8_ = local_948._0_8_;
    auVar9[8] = '\x02';
    auVar9[9] = '\x03';
    auVar9[10] = '\x06';
    auVar9[0xb] = '\a';
    auVar9[0xc] = '\n';
    auVar9[0xd] = '\v';
    auVar9[0xe] = '\x0e';
    auVar9[0xf] = '\x0f';
    auVar9[0] = '\0';
    auVar9[1] = '\x01';
    auVar9[2] = '\x04';
    auVar9[3] = '\x05';
    auVar9[4] = '\b';
    auVar9[5] = '\t';
    auVar9[6] = '\f';
    auVar9[7] = '\r';
    auVar5 = pshufb(auVar10,auVar9);
    auVar5 = phaddw(auVar5,ZEXT816(0));
    auVar5 = phaddw(auVar5,ZEXT816(0));
    local_3f8 = auVar5._0_8_;
    auVar5 = pmovsxwd(auVar5,local_3f8);
    local_348 = auVar5._0_4_;
    local_8f8 = local_348;
    local_368 = auVar5._4_4_;
    local_8fc = local_368;
  }
  else if (in_R8D == 8) {
    auVar5 = pmovzxbw(*(undefined1 (*) [16])(in_RDI + 0x10),
                      *(undefined8 *)*(undefined1 (*) [16])(in_RDI + 0x10));
    auVar6 = pmovzxbw(*(undefined1 (*) [16])(in_RDI + 0x20),
                      *(undefined8 *)*(undefined1 (*) [16])(in_RDI + 0x20));
    local_938._8_8_ = 0;
    local_938._0_8_ = *(ulong *)(in_RDI + 0x18);
    local_948._8_8_ = 0;
    local_948._0_8_ = *(ulong *)(in_RDI + 0x28);
    auVar7 = pmovzxbw(local_938,*(ulong *)(in_RDI + 0x18));
    auVar8 = pmovzxbw(local_948,*(ulong *)(in_RDI + 0x28));
    local_7c8 = auVar8._0_2_;
    sStack_7c6 = auVar8._2_2_;
    sStack_7c4 = auVar8._4_2_;
    sStack_7c2 = auVar8._6_2_;
    sStack_7c0 = auVar8._8_2_;
    sStack_7be = auVar8._10_2_;
    sStack_7bc = auVar8._12_2_;
    sStack_7ba = auVar8._14_2_;
    local_7d8 = auVar6._0_2_;
    sStack_7d6 = auVar6._2_2_;
    sStack_7d4 = auVar6._4_2_;
    sStack_7d2 = auVar6._6_2_;
    sStack_7d0 = auVar6._8_2_;
    sStack_7ce = auVar6._10_2_;
    sStack_7cc = auVar6._12_2_;
    sStack_7ca = auVar6._14_2_;
    local_7e8 = auVar7._0_2_;
    sStack_7e6 = auVar7._2_2_;
    sStack_7e4 = auVar7._4_2_;
    sStack_7e2 = auVar7._6_2_;
    sStack_7e0 = auVar7._8_2_;
    sStack_7de = auVar7._10_2_;
    sStack_7dc = auVar7._12_2_;
    sStack_7da = auVar7._14_2_;
    local_7f8 = auVar5._0_2_;
    sStack_7f6 = auVar5._2_2_;
    sStack_7f4 = auVar5._4_2_;
    sStack_7f2 = auVar5._6_2_;
    sStack_7f0 = auVar5._8_2_;
    sStack_7ee = auVar5._10_2_;
    sStack_7ec = auVar5._12_2_;
    sStack_7ea = auVar5._14_2_;
    local_948._2_2_ = sStack_7c6 + sStack_7d6 + sStack_7e6 + sStack_7f6;
    local_948._0_2_ = local_7c8 + local_7d8 + local_7e8 + local_7f8;
    local_948._4_2_ = sStack_7c4 + sStack_7d4 + sStack_7e4 + sStack_7f4;
    local_948._6_2_ = sStack_7c2 + sStack_7d2 + sStack_7e2 + sStack_7f2;
    local_948._8_2_ = sStack_7c0 + sStack_7d0 + sStack_7e0 + sStack_7f0;
    local_948._10_2_ = sStack_7be + sStack_7ce + sStack_7de + sStack_7ee;
    local_948._12_2_ = sStack_7bc + sStack_7cc + sStack_7dc + sStack_7ec;
    local_948._14_2_ = sStack_7ba + sStack_7ca + sStack_7da + sStack_7ea;
    auVar8._8_8_ = local_948._8_8_;
    auVar8._0_8_ = local_948._0_8_;
    auVar7[8] = '\x02';
    auVar7[9] = '\x03';
    auVar7[10] = '\x06';
    auVar7[0xb] = '\a';
    auVar7[0xc] = '\n';
    auVar7[0xd] = '\v';
    auVar7[0xe] = '\x0e';
    auVar7[0xf] = '\x0f';
    auVar7[0] = '\0';
    auVar7[1] = '\x01';
    auVar7[2] = '\x04';
    auVar7[3] = '\x05';
    auVar7[4] = '\b';
    auVar7[5] = '\t';
    auVar7[6] = '\f';
    auVar7[7] = '\r';
    auVar5 = pshufb(auVar8,auVar7);
    auVar5 = phaddw(auVar5,ZEXT816(0));
    auVar5 = phaddw(auVar5,ZEXT816(0));
    local_408 = auVar5._0_8_;
    auVar5 = pmovsxwd(auVar5,local_408);
    local_388 = auVar5._0_4_;
    local_8f8 = local_388;
    local_3a8 = auVar5._4_4_;
    local_8fc = local_3a8;
  }
  else if (in_R8D == 4) {
    auVar5 = pmovzxbw(*(undefined1 (*) [16])(in_RDI + 8),
                      *(undefined8 *)*(undefined1 (*) [16])(in_RDI + 8));
    local_948._8_8_ = 0;
    local_948._0_8_ = *(ulong *)(in_RDI + 0x10);
    auVar6 = pmovzxbw(local_948,*(ulong *)(in_RDI + 0x10));
    local_828 = auVar6._0_2_;
    sStack_826 = auVar6._2_2_;
    sStack_824 = auVar6._4_2_;
    sStack_822 = auVar6._6_2_;
    sStack_820 = auVar6._8_2_;
    sStack_81e = auVar6._10_2_;
    sStack_81c = auVar6._12_2_;
    sStack_81a = auVar6._14_2_;
    local_838 = auVar5._0_2_;
    sStack_836 = auVar5._2_2_;
    sStack_834 = auVar5._4_2_;
    sStack_832 = auVar5._6_2_;
    sStack_830 = auVar5._8_2_;
    sStack_82e = auVar5._10_2_;
    sStack_82c = auVar5._12_2_;
    sStack_82a = auVar5._14_2_;
    local_948._2_2_ = sStack_826 + sStack_836;
    local_948._0_2_ = local_828 + local_838;
    local_948._4_2_ = sStack_824 + sStack_834;
    local_948._6_2_ = sStack_822 + sStack_832;
    local_948._8_2_ = sStack_820 + sStack_830;
    local_948._10_2_ = sStack_81e + sStack_82e;
    local_948._12_2_ = sStack_81c + sStack_82c;
    local_948._14_2_ = sStack_81a + sStack_82a;
    auVar6._8_8_ = local_948._8_8_;
    auVar6._0_8_ = local_948._0_8_;
    auVar5[8] = '\x02';
    auVar5[9] = '\x03';
    auVar5[10] = '\x06';
    auVar5[0xb] = '\a';
    auVar5[0xc] = '\n';
    auVar5[0xd] = '\v';
    auVar5[0xe] = '\x0e';
    auVar5[0xf] = '\x0f';
    auVar5[0] = '\0';
    auVar5[1] = '\x01';
    auVar5[2] = '\x04';
    auVar5[3] = '\x05';
    auVar5[4] = '\b';
    auVar5[5] = '\t';
    auVar5[6] = '\f';
    auVar5[7] = '\r';
    auVar5 = pshufb(auVar6,auVar5);
    auVar5 = phaddw(auVar5,ZEXT816(0));
    auVar5 = phaddw(auVar5,ZEXT816(0));
    local_418 = auVar5._0_8_;
    auVar5 = pmovsxwd(auVar5,local_418);
    local_3c8 = auVar5._0_4_;
    local_8f8 = local_3c8;
    local_3e8 = auVar5._4_4_;
    local_8fc = local_3e8;
  }
  local_900 = (ushort)((int)((((uint)*(byte *)(in_RDI + in_R8D * 6) + local_8f8) -
                             (uint)*(byte *)(in_RDI + (in_R8D << 2))) + in_R8D) >> cVar3 + 1) |
              (ushort)(((int)((((uint)*(byte *)(in_RDI + (in_R8D * 6 + 1)) + local_8fc) -
                              (uint)*(byte *)(in_RDI + (in_R8D * 4 + 1))) + in_R8D) >> cVar3 + 1) <<
                      8);
  if (in_R8D == 4) {
    uVar1 = CONCAT26(local_900,CONCAT24(local_900,CONCAT22(local_900,local_900)));
    *in_RDX = uVar1;
    *(undefined8 *)((long)in_RDX + (long)in_ECX) = uVar1;
    *(undefined8 *)((long)in_RDX + (long)(in_ECX * 2)) = uVar1;
    *(undefined8 *)((long)in_RDX + (long)(in_ECX * 3)) = uVar1;
  }
  else if (in_R8D == 8) {
    uVar1 = CONCAT26(local_900,CONCAT24(local_900,CONCAT22(local_900,local_900)));
    uVar2 = CONCAT26(local_900,CONCAT24(local_900,CONCAT22(local_900,local_900)));
    *in_RDX = uVar1;
    in_RDX[1] = uVar2;
    *(undefined8 *)((long)in_RDX + (long)in_ECX) = uVar1;
    ((undefined8 *)((long)in_RDX + (long)in_ECX))[1] = uVar2;
    puVar4 = (undefined8 *)((long)in_RDX + (long)(in_ECX << 1));
    *puVar4 = uVar1;
    puVar4[1] = uVar2;
    puVar4 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 3));
    *puVar4 = uVar1;
    puVar4[1] = uVar2;
    puVar4 = (undefined8 *)((long)in_RDX + (long)(in_ECX << 2));
    *puVar4 = uVar1;
    puVar4[1] = uVar2;
    puVar4 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 5));
    *puVar4 = uVar1;
    puVar4[1] = uVar2;
    puVar4 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 6));
    *puVar4 = uVar1;
    puVar4[1] = uVar2;
    puVar4 = (undefined8 *)((long)in_RDX + (long)(in_ECX * 7));
    *puVar4 = uVar1;
    puVar4[1] = uVar2;
  }
  else {
    uVar1 = CONCAT26(local_900,CONCAT24(local_900,CONCAT22(local_900,local_900)));
    uVar2 = CONCAT26(local_900,CONCAT24(local_900,CONCAT22(local_900,local_900)));
    local_8e8 = in_RDX;
    for (local_908 = 0; local_908 < in_R8D; local_908 = local_908 + 8) {
      *local_8e8 = uVar1;
      local_8e8[1] = uVar2;
      *(undefined8 *)((long)local_8e8 + (long)in_ECX) = uVar1;
      ((undefined8 *)((long)local_8e8 + (long)in_ECX))[1] = uVar2;
      puVar4 = (undefined8 *)((long)local_8e8 + (long)(in_ECX << 1));
      *puVar4 = uVar1;
      puVar4[1] = uVar2;
      puVar4 = (undefined8 *)((long)local_8e8 + (long)(in_ECX * 3));
      *puVar4 = uVar1;
      puVar4[1] = uVar2;
      local_8e8[2] = uVar1;
      local_8e8[3] = uVar2;
      puVar4 = (undefined8 *)((long)local_8e8 + (long)in_ECX + 0x10);
      *puVar4 = uVar1;
      puVar4[1] = uVar2;
      puVar4 = (undefined8 *)((long)local_8e8 + (long)(in_ECX << 1) + 0x10);
      *puVar4 = uVar1;
      puVar4[1] = uVar2;
      puVar4 = (undefined8 *)((long)local_8e8 + (long)(in_ECX * 3) + 0x10);
      *puVar4 = uVar1;
      puVar4[1] = uVar2;
      puVar4 = (undefined8 *)((long)local_8e8 + (long)(in_ECX << 2));
      *puVar4 = uVar1;
      puVar4[1] = uVar2;
      puVar4 = (undefined8 *)((long)local_8e8 + (long)(in_ECX * 5));
      *puVar4 = uVar1;
      puVar4[1] = uVar2;
      puVar4 = (undefined8 *)((long)local_8e8 + (long)(in_ECX * 6));
      *puVar4 = uVar1;
      puVar4[1] = uVar2;
      puVar4 = (undefined8 *)((long)local_8e8 + (long)(in_ECX * 7));
      *puVar4 = uVar1;
      puVar4[1] = uVar2;
      puVar4 = (undefined8 *)((long)local_8e8 + (long)(in_ECX << 2) + 0x10);
      *puVar4 = uVar1;
      puVar4[1] = uVar2;
      puVar4 = (undefined8 *)((long)local_8e8 + (long)(in_ECX * 5) + 0x10);
      *puVar4 = uVar1;
      puVar4[1] = uVar2;
      puVar4 = (undefined8 *)((long)local_8e8 + (long)(in_ECX * 6) + 0x10);
      *puVar4 = uVar1;
      puVar4[1] = uVar2;
      puVar4 = (undefined8 *)((long)local_8e8 + (long)(in_ECX * 7) + 0x10);
      *puVar4 = uVar1;
      puVar4[1] = uVar2;
      local_8e8 = (undefined8 *)((long)local_8e8 + (long)(in_ECX << 3));
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_dc_sse42(UWORD8 *pu1_ref,
                                      WORD32 src_strd,
                                      UWORD8 *pu1_dst,
                                      WORD32 dst_strd,
                                      WORD32 nt,
                                      WORD32 mode)
{

    WORD32 acc_dc_u, acc_dc_v;
    WORD32 dc_val_u, dc_val_v;
    WORD32 row;
    WORD32 log2nt = 5;
    __m128i src_temp1, src_temp3, src_temp4, src_temp5, src_temp6, m_mask;
    __m128i src_temp7, src_temp8, src_temp9, src_temp10;
    __m128i m_zero = _mm_set1_epi32(0);
    UNUSED(src_strd);
    UNUSED(mode);

    switch(nt)
    {
        case 32:
            log2nt = 5;
            break;
        case 16:
            log2nt = 4;
            break;
        case 8:
            log2nt = 3;
            break;
        case 4:
            log2nt = 2;
            break;
        default:
            break;
    }

    acc_dc_u = 0;
    acc_dc_v = 0;

    /* Calculate DC value for the transform block */

    m_mask = _mm_loadu_si128((__m128i *)&IHEVCE_SHUFFLEMASKY9[0]);

    if(nt == 16)
    {
        __m128i temp_sad;

        src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + (2 * nt)));
        src_temp4 =  _mm_loadu_si128((__m128i *)(pu1_ref + (2 * nt) + 16));
        src_temp7 =  _mm_loadu_si128((__m128i *)(pu1_ref + (2 * nt) + 32));
        src_temp8 =  _mm_loadu_si128((__m128i *)(pu1_ref + (2 * nt) + 48));

        src_temp5 =  _mm_cvtepu8_epi16(src_temp3);
        src_temp6 =  _mm_cvtepu8_epi16(src_temp4);
        src_temp9 =  _mm_cvtepu8_epi16(src_temp7);
        src_temp10 =  _mm_cvtepu8_epi16(src_temp8);

        src_temp3 = _mm_srli_si128(src_temp3, 8);
        src_temp4 = _mm_srli_si128(src_temp4, 8);
        src_temp7 = _mm_srli_si128(src_temp7, 8);
        src_temp8 = _mm_srli_si128(src_temp8, 8);

        src_temp3 =  _mm_cvtepu8_epi16(src_temp3);
        src_temp4 =  _mm_cvtepu8_epi16(src_temp4);
        src_temp7 =  _mm_cvtepu8_epi16(src_temp7);
        src_temp8 =  _mm_cvtepu8_epi16(src_temp8);

        src_temp4 = _mm_add_epi16(src_temp4, src_temp6);
        src_temp6 = _mm_add_epi16(src_temp3, src_temp5);
        src_temp8 = _mm_add_epi16(src_temp7, src_temp8);
        src_temp10 = _mm_add_epi16(src_temp9, src_temp10);

        src_temp4 = _mm_add_epi16(src_temp4, src_temp6);
        src_temp8 = _mm_add_epi16(src_temp8, src_temp10);

        src_temp4 = _mm_add_epi16(src_temp4, src_temp8);
        src_temp4 = _mm_shuffle_epi8(src_temp4, m_mask);
        src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);
        src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

        src_temp4 = _mm_cvtepi16_epi32(src_temp4);
        temp_sad  = _mm_srli_si128(src_temp4, 4); /* Next 32 bits */
        acc_dc_u  = _mm_cvtsi128_si32(src_temp4);
        acc_dc_v  = _mm_cvtsi128_si32(temp_sad);
    }

    else if(nt == 8)
    {
        __m128i temp_sad;
        src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + (2 * nt)));
        src_temp4 =  _mm_loadu_si128((__m128i *)(pu1_ref + (2 * nt) + 16));

        src_temp5 =  _mm_cvtepu8_epi16(src_temp3);
        src_temp6 =  _mm_cvtepu8_epi16(src_temp4);

        src_temp3 = _mm_srli_si128(src_temp3, 8);
        src_temp4 = _mm_srli_si128(src_temp4, 8);

        src_temp3 =  _mm_cvtepu8_epi16(src_temp3);
        src_temp4 =  _mm_cvtepu8_epi16(src_temp4);

        src_temp4 = _mm_add_epi16(src_temp4, src_temp6);
        src_temp6 = _mm_add_epi16(src_temp3, src_temp5);

        src_temp4 = _mm_add_epi16(src_temp4, src_temp6);
        src_temp4 = _mm_shuffle_epi8(src_temp4, m_mask);
        src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);
        src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

        src_temp4 = _mm_cvtepi16_epi32(src_temp4);
        temp_sad  = _mm_srli_si128(src_temp4, 4); /* Next 32 bits */
        acc_dc_u  = _mm_cvtsi128_si32(src_temp4);
        acc_dc_v  = _mm_cvtsi128_si32(temp_sad);
    }

    else if(nt == 4)
    {
        __m128i temp_sad;
        src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + (2 * nt)));

        src_temp5 =  _mm_cvtepu8_epi16(src_temp3);
        src_temp4 = _mm_srli_si128(src_temp3, 8);
        src_temp4 =  _mm_cvtepu8_epi16(src_temp4);

        src_temp4 = _mm_add_epi16(src_temp4, src_temp5);

        src_temp4 = _mm_shuffle_epi8(src_temp4, m_mask);
        src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);
        src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

        src_temp4 = _mm_cvtepi16_epi32(src_temp4);
        temp_sad  = _mm_srli_si128(src_temp4, 4); /* Next 32 bits */
        acc_dc_u  = _mm_cvtsi128_si32(src_temp4);
        acc_dc_v  = _mm_cvtsi128_si32(temp_sad);
    }


    acc_dc_u += pu1_ref[6 * nt];
    acc_dc_v += pu1_ref[6 * nt + 1];

    acc_dc_u -= pu1_ref[4 * nt];
    acc_dc_v -= pu1_ref[4 * nt + 1];

    dc_val_u = (acc_dc_u + nt) >> (log2nt + 1);
    dc_val_v = (acc_dc_v + nt) >> (log2nt + 1);

    dc_val_u = dc_val_u | (dc_val_v << 8);

    /* Fill the remaining rows with DC value*/

    if(nt == 4)
    {
        src_temp1 = _mm_set1_epi16(dc_val_u);

        /*  pu1_dst[(row * dst_strd) + col] = dc_val;*/
        _mm_storel_epi64((__m128i *)(pu1_dst + (0 * dst_strd)), src_temp1);
        _mm_storel_epi64((__m128i *)(pu1_dst + (1 * dst_strd)), src_temp1);
        _mm_storel_epi64((__m128i *)(pu1_dst + (2 * dst_strd)), src_temp1);
        _mm_storel_epi64((__m128i *)(pu1_dst + (3 * dst_strd)), src_temp1);

    }
    else if(nt == 8)
    {
        src_temp1 = _mm_set1_epi16(dc_val_u);

        /*  pu1_dst[(row * dst_strd) + col] = dc_val;*/
        _mm_storeu_si128((__m128i *)(pu1_dst + (0 * dst_strd)), src_temp1);
        _mm_storeu_si128((__m128i *)(pu1_dst + (1 * dst_strd)), src_temp1);
        _mm_storeu_si128((__m128i *)(pu1_dst + (2 * dst_strd)), src_temp1);
        _mm_storeu_si128((__m128i *)(pu1_dst + (3 * dst_strd)), src_temp1);

        _mm_storeu_si128((__m128i *)(pu1_dst + (4 * dst_strd)), src_temp1);
        _mm_storeu_si128((__m128i *)(pu1_dst + (5 * dst_strd)), src_temp1);
        _mm_storeu_si128((__m128i *)(pu1_dst + (6 * dst_strd)), src_temp1);
        _mm_storeu_si128((__m128i *)(pu1_dst + (7 * dst_strd)), src_temp1);

    }

    else /* nt == 16 */
    {

        src_temp1 = _mm_set1_epi16(dc_val_u);

        for(row = 0; row < nt; row += 8)
        {
            /*  pu1_dst[(row * dst_strd) + col] = dc_val;*/
            _mm_storeu_si128((__m128i *)(pu1_dst + (0 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + (1 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + (2 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + (3 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (0 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (1 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (2 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (3 * dst_strd)), src_temp1);

            _mm_storeu_si128((__m128i *)(pu1_dst + (4 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + (5 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + (6 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + (7 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (4 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (5 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (6 * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + (7 * dst_strd)), src_temp1);

            pu1_dst += 8 * dst_strd;
        }


    }

}